

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint __thiscall
ON_SubDMeshFragment::GetFaceFragments
          (ON_SubDMeshFragment *this,ON_SimpleArray<const_ON_SubDMeshFragment_*> *fragments)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = this->m_face_fragment_count;
  if (-1 < *(int *)(fragments + 0x14)) {
    *(undefined4 *)(fragments + 0x10) = 0;
  }
  ON_SimpleArray<const_ON_SubDMeshFragment_*>::Reserve(fragments,(ulong)uVar1);
  uVar2 = GetFaceFragments(this,*(ON_SubDMeshFragment ***)(fragments + 8),(ulong)uVar1);
  ON_SimpleArray<const_ON_SubDMeshFragment_*>::SetCapacity(fragments,(ulong)uVar2);
  return uVar2;
}

Assistant:

unsigned int ON_SubDMeshFragment::GetFaceFragments(
  ON_SimpleArray<const ON_SubDMeshFragment*>& fragments
) const
{
  unsigned int fragment_count = FaceFragmentCount();
  fragments.SetCount(0);
  fragments.Reserve(fragment_count);
  fragment_count = GetFaceFragments(fragments.Array(), fragment_count);
  fragments.SetCapacity(fragment_count);
  return fragment_count;
}